

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeHeapBlock.cpp
# Opt level: O0

void __thiscall Memory::LargeHeapBlock::PageHeapLockPages(LargeHeapBlock *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  LargeObjectHeader *pLVar5;
  DWORD local_14;
  LargeHeapBlock *pLStack_10;
  DWORD oldProtect;
  LargeHeapBlock *this_local;
  
  if ((this->pageHeapData->isLockedWithPageHeap & 1U) == 0) {
    pLStack_10 = this;
    if (this->allocCount != 0) {
      if (this->allocCount != 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/LargeHeapBlock.cpp"
                           ,0x94d,"(this->allocCount == 1)","this->allocCount == 1");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      VerifyPageHeapPattern(this);
    }
    pLVar5 = GetHeaderFromAddress(this->pageHeapData->objectAddress);
    pLVar5->field_0x1a = pLVar5->field_0x1a & 0xfb | 4;
    BVar3 = VirtualProtect(this->pageHeapData->objectPageAddr,this->pageCount << 0xc,2,&local_14);
    if (BVar3 == 0) {
      pLVar5 = GetHeaderFromAddress(this->pageHeapData->objectAddress);
      pLVar5->field_0x1a = pLVar5->field_0x1a & 0xfb;
    }
    else {
      this->pageHeapData->isLockedWithPageHeap = true;
    }
  }
  return;
}

Assistant:

void 
LargeHeapBlock::PageHeapLockPages()
{
    if (!pageHeapData->isLockedWithPageHeap)
    {
        if (this->allocCount > 0) // in case OOM while adding heapblock to heapBlockMap, we release page before setting the pattern
        {
            Assert(this->allocCount == 1); // one object per heapblock in pageheap
            VerifyPageHeapPattern();
        }

        DWORD oldProtect;
        GetHeaderFromAddress(pageHeapData->objectAddress)->isObjectPageLocked = true;
        if (VirtualProtect(pageHeapData->objectPageAddr, this->pageCount * AutoSystemInfo::PageSize, PAGE_READONLY, &oldProtect))
        {
            pageHeapData->isLockedWithPageHeap = true;
        }
        else
        {
            GetHeaderFromAddress(pageHeapData->objectAddress)->isObjectPageLocked = false;
        }
    }
}